

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::~EventLoop(EventLoop *this)

{
  EVP_PKEY_CTX *in_RSI;
  EventLoop *this_local;
  
  cleanup(this,in_RSI);
  std::
  unordered_set<EventLoop::TimerData_*,_EventLoop::TimerDataHash,_EventLoop::TimerDataHash,_std::allocator<EventLoop::TimerData_*>_>
  ::~unordered_set(&this->mTimersById);
  std::
  multiset<EventLoop::TimerData_*,_EventLoop::TimerDataSet,_std::allocator<EventLoop::TimerData_*>_>
  ::~multiset(&this->mTimersByTime);
  std::
  map<int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
  ::~map(&this->mSockets);
  std::queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_>::~queue(&this->mEvents);
  std::enable_shared_from_this<EventLoop>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<EventLoop>);
  return;
}

Assistant:

EventLoop::~EventLoop()
{
    cleanup();
}